

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsCopyString(JsValueRef value,char *buffer,size_t bufferSize,size_t *length)

{
  JsErrorCode JVar1;
  WideToNarrow utf8Str;
  char16 *str;
  size_t strLength;
  
  if (value != (JsValueRef)0x0) {
    utf8Str.freeDst = false;
    utf8Str._25_7_ = 0;
    str = (char16 *)0x0;
    JVar1 = JsStringToPointer(value,(WCHAR **)&utf8Str.freeDst,(size_t *)&str);
    if (JVar1 == JsNoError) {
      utf8Str.allocateCount._0_1_ = '\0';
      utf8::
      NarrowWideStringConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>::
      ConvertNoAlloc((LPCWSTR)utf8Str._24_8_,(size_t)str,buffer,bufferSize,(size_t *)&utf8Str);
      if (length != (size_t *)0x0) {
        *length = (size_t)utf8Str.dst;
      }
      if ((buffer != (char *)0x0) && ((char)utf8Str.allocateCount == '\x01')) {
        free(buffer);
      }
      JVar1 = JsNoError;
    }
    return JVar1;
  }
  return JsErrorNullArgument;
}

Assistant:

CHAKRA_API JsCopyString(
    _In_ JsValueRef value,
    _Out_opt_ char* buffer,
    _In_ size_t bufferSize,
    _Out_opt_ size_t* length)
{
    PARAM_NOT_NULL(value);
    VALIDATE_JSREF(value);

    const char16* str = nullptr;
    size_t strLength = 0;
    JsErrorCode errorCode = JsStringToPointer(value, &str, &strLength);
    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    utf8::WideToNarrow utf8Str(str, strLength, buffer, bufferSize);
    if (length)
    {
        *length = utf8Str.Length();
    }

    return JsNoError;
}